

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.cpp
# Opt level: O3

string * __thiscall
arangodb::velocypack::HexDump::toString_abi_cxx11_(string *__return_storage_ptr__,HexDump *this)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             this->length / (ulong)(long)this->valuesPerLine +
             ((this->separator)._M_string_length + this->length) * 4 + 1);
  if (0 < (long)this->length) {
    puVar4 = this->data;
    puVar3 = puVar4 + this->length;
    iVar2 = 0;
    do {
      iVar1 = 0;
      if (iVar2 != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,(this->separator)._M_dataplus._M_p,
                   (this->separator)._M_string_length);
        iVar1 = iVar2;
        if (iVar2 == this->valuesPerLine && 0 < this->valuesPerLine) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,'\n');
          iVar1 = 0;
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,(this->header)._M_dataplus._M_p,
                 (this->header)._M_string_length);
      appendHex(__return_storage_ptr__,*puVar4);
      puVar4 = puVar4 + 1;
      iVar2 = iVar1 + 1;
    } while (puVar4 < puVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HexDump::toString() const {
  std::string result;
  result.reserve(4 * (length + separator.size()) + (length / valuesPerLine) +
                 1);

  uint8_t const* p = data;
  uint8_t const* e = p + length;
  int current = 0;
  while (p < e) {
    if (current != 0) {
      result.append(separator);

      if (valuesPerLine > 0 && current == valuesPerLine) {
        result.push_back('\n');
        current = 0;
      }
    }

    result.append(header);
    appendHex(result, *p++);
    ++current;
  }

  return result;
}